

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferAccessFlagsCase::testBuffer
          (BufferAccessFlagsCase *this)

{
  CallLogWrapper *this_00;
  uint access;
  BufferParamVerifier *pBVar1;
  long lVar2;
  
  pBVar1 = (this->super_BufferCase).m_verifier;
  lVar2 = 0;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x911f,0
            );
  this_00 = &(this->super_BufferCase).super_ApiCase.super_CallLogWrapper;
  do {
    glu::CallLogWrapper::glBufferData
              (this_00,(this->super_BufferCase).m_bufferTarget,0x10,(void *)0x0,0x88ea);
    access = *(uint *)((long)&DAT_01c16fd0 + lVar2);
    glu::CallLogWrapper::glMapBufferRange
              (this_00,(this->super_BufferCase).m_bufferTarget,0,0x10,access);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x911f
               ,(ulong)access);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glUnmapBuffer(this_00,(this->super_BufferCase).m_bufferTarget);
    ApiCase::expectError((ApiCase *)this,0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x44);
  return;
}

Assistant:

void testBuffer (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_ACCESS_FLAGS, 0);

		const GLenum accessFlags[] =
		{
			GL_MAP_READ_BIT,

			GL_MAP_WRITE_BIT,
			GL_MAP_WRITE_BIT																	| GL_MAP_INVALIDATE_RANGE_BIT,
			GL_MAP_WRITE_BIT																									| GL_MAP_INVALIDATE_BUFFER_BIT,
			GL_MAP_WRITE_BIT																	| GL_MAP_INVALIDATE_RANGE_BIT	| GL_MAP_INVALIDATE_BUFFER_BIT,

			GL_MAP_WRITE_BIT									| GL_MAP_FLUSH_EXPLICIT_BIT,
			GL_MAP_WRITE_BIT									| GL_MAP_FLUSH_EXPLICIT_BIT		| GL_MAP_INVALIDATE_RANGE_BIT,
			GL_MAP_WRITE_BIT									| GL_MAP_FLUSH_EXPLICIT_BIT										| GL_MAP_INVALIDATE_BUFFER_BIT,
			GL_MAP_WRITE_BIT									| GL_MAP_FLUSH_EXPLICIT_BIT		| GL_MAP_INVALIDATE_RANGE_BIT	| GL_MAP_INVALIDATE_BUFFER_BIT,

			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT										| GL_MAP_INVALIDATE_RANGE_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT																		| GL_MAP_INVALIDATE_BUFFER_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT										| GL_MAP_INVALIDATE_RANGE_BIT	| GL_MAP_INVALIDATE_BUFFER_BIT,

			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT		| GL_MAP_FLUSH_EXPLICIT_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT		| GL_MAP_FLUSH_EXPLICIT_BIT		| GL_MAP_INVALIDATE_RANGE_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT		| GL_MAP_FLUSH_EXPLICIT_BIT										| GL_MAP_INVALIDATE_BUFFER_BIT,
			GL_MAP_WRITE_BIT	| GL_MAP_UNSYNCHRONIZED_BIT		| GL_MAP_FLUSH_EXPLICIT_BIT		| GL_MAP_INVALIDATE_RANGE_BIT	| GL_MAP_INVALIDATE_BUFFER_BIT,

		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(accessFlags); ++ndx)
		{
			glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_COPY);
			glMapBufferRange(m_bufferTarget, 0, 16, accessFlags[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_ACCESS_FLAGS, accessFlags[ndx]);
			expectError(GL_NO_ERROR);

			glUnmapBuffer(m_bufferTarget);
			expectError(GL_NO_ERROR);
		}
	}